

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O1

void check_variables(void)

{
  _Bool _Var1;
  int iVar2;
  retro_variable var;
  char *local_18;
  char *pcStack_10;
  
  pcStack_10 = (char *)0x0;
  local_18 = "gb_color";
  _Var1 = (*env_cb)(0xf,&local_18);
  if (pcStack_10 != (char *)0x0 && _Var1) {
    iVar2 = strcmp(pcStack_10,"Gray");
    curr_color_scheme = GB_SCREEN_COLORS_GREEN;
    if (iVar2 == 0) {
      curr_color_scheme = GB_SCREEN_COLORS_GRAY;
    }
  }
  local_18 = "gb_bootrom_skip";
  _Var1 = (*env_cb)(0xf,&local_18);
  if (pcStack_10 != (char *)0x0 && _Var1) {
    iVar2 = strcmp(pcStack_10,"true");
    skip_bootrom = iVar2 == 0;
  }
  return;
}

Assistant:

static void check_variables()
{
   struct retro_variable var = {0};

   var.key = "gb_color";
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE, &var) && var.value)
   {
      if (!strcmp(var.value, "Gray"))
         curr_color_scheme = GB_SCREEN_COLORS_GRAY;
      else
         curr_color_scheme = GB_SCREEN_COLORS_GREEN;
   }

   var.key = "gb_bootrom_skip";
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE, &var) && var.value)
   {
      if (!strcmp(var.value, "true"))
         skip_bootrom = true;
      else
         skip_bootrom = false;
   }
}